

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::BlockedReceive::close(BlockedReceive *this,int __fd)

{
  long *plVar1;
  StringPtr *in_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  bool bVar3;
  StringPtr reason_local;
  DebugExpression<bool> _kjCondition;
  undefined1 uStack_6f;
  Array<char> local_68;
  Fault f;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  bVar3 = *(long *)(lVar2 + 0x20) == 0;
  __kjCondition = CONCAT11(uStack_6f,bVar3);
  if (bVar3) {
    plVar1 = *(long **)(lVar2 + 8);
    __kjCondition = (uint16_t)in_RDX;
    str<kj::StringPtr&>((String *)&local_68,(kj *)&reason_local,in_RDX);
    OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>::OneOf<kj::WebSocket::Close,int>
              ((OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)&f,
               (Close *)&_kjCondition);
    (**(code **)(*plVar1 + 0x10))
              (plVar1,(OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)&f);
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&f);
    Array<char>::~Array(&local_68);
    if (*(long *)(*(long *)(lVar2 + 0x10) + 0x28) == lVar2) {
      *(undefined8 *)(*(long *)(lVar2 + 0x10) + 0x28) = 0;
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    return (int)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1072,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(Close { code, kj::str(reason) }));
      pipe.endState(*this);
      return kj::READY_NOW;
    }